

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O1

void If_ManComputeRequired(If_Man_t *p)

{
  int iVar1;
  If_Par_t *pIVar2;
  float *pfVar3;
  uint *puVar4;
  void **ppvVar5;
  void *pvVar6;
  Vec_Ptr_t *pVVar7;
  If_Man_t *pIVar8;
  char *pcVar9;
  long lVar10;
  uint iCo;
  uint uVar11;
  char *pObj;
  Tim_Man_t *pTVar12;
  If_Man_t *pIVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  
  If_ManMarkMapping(p);
  pTVar12 = p->pManTim;
  pObj = (char *)0x0;
  pIVar13 = p;
  fVar17 = If_ManDelayMax(p,0);
  p->RequiredGlo = fVar17;
  pIVar2 = p->pPars;
  if (pTVar12 == (Tim_Man_t *)0x0) {
    pfVar3 = pIVar2->pTimesReq;
    if ((pfVar3 == (float *)0x0) || (pIVar2->fAreaOnly != 0)) {
      if ((pIVar2->nRelaxRatio != 0) &&
         ((pIVar2->DelayTargetNew == 0.0 && (!NAN(pIVar2->DelayTargetNew))))) {
        pIVar2->DelayTargetNew = (((float)pIVar2->nRelaxRatio + 100.0) * fVar17) / 100.0;
      }
      fVar18 = pIVar2->DelayTarget;
      if ((fVar18 != -1.0) || (NAN(fVar18))) {
        if (fVar17 <= fVar18 + p->fEpsilon) {
          if (fVar17 < fVar18 - p->fEpsilon) {
            if (p->fNextRound == 0) {
              p->fNextRound = 1;
            }
            p->RequiredGlo = fVar18;
          }
        }
        else if (p->fNextRound == 0) {
          p->fNextRound = 1;
          pObj = "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n";
          Abc_Print((int)pIVar13,
                    "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n",
                    (double)fVar18);
        }
      }
      else if (0.0 < pIVar2->DelayTargetNew) {
        p->RequiredGlo = pIVar2->DelayTargetNew;
      }
      pIVar2 = p->pPars;
      if (pIVar2->fAreaOnly != 0) {
        return;
      }
      if (pIVar2->fDoAverage == 0) {
        if (pIVar2->fLatchPaths == 0) {
          lVar16 = (long)p->vCos->nSize;
          if (0 < lVar16) {
            ppvVar5 = p->vCos->pArray;
            fVar17 = p->RequiredGlo;
            lVar10 = 0;
            do {
              pObj = *(char **)((long)ppvVar5[lVar10] + 0x18);
              ((If_Obj_t *)pObj)->Required = fVar17;
              lVar10 = lVar10 + 1;
            } while (lVar16 != lVar10);
          }
        }
        else {
          uVar11 = p->nObjs[3] - pIVar2->nLatchesCo;
          pVVar7 = p->vCos;
          iVar1 = pVVar7->nSize;
          if ((int)uVar11 < iVar1) {
            pObj = (char *)(ulong)uVar11;
            do {
              if ((int)uVar11 < 0) goto LAB_0040c4d2;
              *(float *)(*(long *)((long)pVVar7->pArray[(long)pObj] + 0x18) + 0x34) = p->RequiredGlo
              ;
              pObj = (char *)((long)pObj + 1);
            } while ((int)pObj < iVar1);
          }
        }
      }
      else {
        iVar1 = pIVar2->nRelaxRatio;
        pVVar7 = p->vCos;
        uVar11 = pVVar7->nSize;
        if (iVar1 == 0) {
          if (0 < (int)uVar11) {
            ppvVar5 = pVVar7->pArray;
            uVar15 = 0;
            do {
              pObj = *(char **)((long)ppvVar5[uVar15] + 0x18);
              ((If_Obj_t *)pObj)->Required = (((If_Obj_t *)pObj)->CutBest).Delay;
              uVar15 = uVar15 + 1;
            } while (uVar11 != uVar15);
          }
        }
        else if (0 < (int)uVar11) {
          ppvVar5 = pVVar7->pArray;
          uVar15 = 0;
          do {
            pObj = *(char **)((long)ppvVar5[uVar15] + 0x18);
            ((If_Obj_t *)pObj)->Required =
                 ((((If_Obj_t *)pObj)->CutBest).Delay * ((float)iVar1 + 100.0)) / 100.0;
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
        }
      }
    }
    else {
      pIVar8 = (If_Man_t *)(long)p->vCos->nSize;
      if ((long)pIVar8 < 1) {
        uVar15 = 0;
      }
      else {
        pObj = (char *)p->vCos->pArray;
        fVar17 = p->fEpsilon;
        pIVar13 = (If_Man_t *)0x0;
        uVar15 = 0;
        do {
          lVar16 = *(long *)(*(long *)(&((If_Obj_t *)pObj)->field_0x0 + (long)pIVar13 * 8) + 0x18);
          fVar18 = pfVar3[(long)pIVar13];
          if (*(float *)(lVar16 + 0x5c) <= fVar18 + fVar17) {
            *(float *)(lVar16 + 0x34) = fVar18;
          }
          else {
            *(float *)(lVar16 + 0x34) = *(float *)(lVar16 + 0x5c);
            uVar15 = (ulong)((int)uVar15 + 1);
          }
          pIVar13 = (If_Man_t *)((long)&pIVar13->pName + 1);
        } while (pIVar8 != pIVar13);
      }
      if (((int)uVar15 != 0) && (p->fReqTimeWarn == 0)) {
        pcVar9 = "";
        if (1 < (int)uVar15) {
          pcVar9 = "s";
        }
        pObj = "Required times are exceeded at %d output%s. The earliest arrival times are used.\n";
        Abc_Print((int)pIVar13,
                  "Required times are exceeded at %d output%s. The earliest arrival times are used.\n"
                  ,uVar15,pcVar9);
        p->fReqTimeWarn = 1;
      }
    }
    pVVar7 = p->vObjsRev;
    if (0 < pVVar7->nSize) {
      lVar16 = 0;
      do {
        pvVar6 = pVVar7->pArray[lVar16];
        if (*(int *)((long)pvVar6 + 0xc) != 0) {
          If_CutPropagateRequired
                    (p,(If_Obj_t *)pObj,(If_Cut_t *)((long)pvVar6 + 0x50),
                     *(float *)((long)pvVar6 + 0x34));
        }
        lVar16 = lVar16 + 1;
        pVVar7 = p->vObjsRev;
      } while (lVar16 < pVVar7->nSize);
    }
  }
  else {
    if (((pIVar2->nRelaxRatio != 0) && (pIVar2->DelayTargetNew == 0.0)) &&
       (!NAN(pIVar2->DelayTargetNew))) {
      pIVar2->DelayTargetNew = (((float)pIVar2->nRelaxRatio + 100.0) * fVar17) / 100.0;
    }
    fVar18 = pIVar2->DelayTarget;
    if ((fVar18 != -1.0) || (NAN(fVar18))) {
      if (fVar17 <= fVar18 + p->fEpsilon) {
        if (fVar17 < fVar18 - p->fEpsilon) {
          if (p->fNextRound == 0) {
            p->fNextRound = 1;
          }
          p->RequiredGlo = fVar18;
        }
      }
      else if (p->fNextRound == 0) {
        p->fNextRound = 1;
        pObj = "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n";
        Abc_Print((int)pIVar13,
                  "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n",
                  (double)fVar18);
      }
    }
    else if (0.0 < pIVar2->DelayTargetNew) {
      p->RequiredGlo = pIVar2->DelayTargetNew;
    }
    if (p->pPars->fAreaOnly == 0) {
      Tim_ManIncrementTravId(p->pManTim);
      if (p->vCoAttrs == (Vec_Int_t *)0x0) {
        pIVar2 = p->pPars;
        if (pIVar2->fDoAverage == 0) {
          if (pIVar2->fLatchPaths == 0) {
            Tim_ManInitPoRequiredAll(p->pManTim,p->RequiredGlo);
          }
          else {
            uVar11 = pIVar2->nLatchesCoBox;
            uVar14 = p->nObjs[3] - p->pPars->nLatchesCo;
            iCo = uVar11;
            if ((int)uVar11 < (int)uVar14) {
              do {
                if (((int)uVar11 < 0) || (p->vCos->nSize <= (int)iCo)) goto LAB_0040c4d2;
                pObj = (char *)(ulong)iCo;
                Tim_ManSetCoRequired(p->pManTim,iCo,1e+20);
                iCo = iCo + 1;
                uVar14 = p->nObjs[3] - p->pPars->nLatchesCo;
              } while ((int)iCo < (int)uVar14);
            }
            uVar11 = uVar14;
            if ((int)uVar14 < p->vCos->nSize) {
              do {
                pObj = (char *)(ulong)uVar11;
                if ((int)uVar14 < 0) {
LAB_0040c4d2:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                Tim_ManSetCoRequired(p->pManTim,uVar11,p->RequiredGlo);
                uVar11 = uVar11 + 1;
              } while ((int)uVar11 < p->vCos->nSize);
            }
          }
        }
        else {
          pVVar7 = p->vCos;
          if (pIVar2->nRelaxRatio == 0) {
            if (0 < pVVar7->nSize) {
              uVar15 = 0;
              do {
                pObj = (char *)(uVar15 & 0xffffffff);
                Tim_ManSetCoRequired
                          (p->pManTim,(int)uVar15,
                           *(float *)(*(long *)((long)pVVar7->pArray[uVar15] + 0x18) + 0x5c));
                uVar15 = uVar15 + 1;
                pVVar7 = p->vCos;
              } while ((long)uVar15 < (long)pVVar7->nSize);
            }
          }
          else if (0 < pVVar7->nSize) {
            uVar15 = 0;
            do {
              pObj = (char *)(uVar15 & 0xffffffff);
              Tim_ManSetCoRequired
                        (p->pManTim,(int)uVar15,
                         (((float)p->pPars->nRelaxRatio + 100.0) *
                         *(float *)(*(long *)((long)pVVar7->pArray[uVar15] + 0x18) + 0x5c)) / 100.0)
              ;
              uVar15 = uVar15 + 1;
              pVVar7 = p->vCos;
            } while ((long)uVar15 < (long)pVVar7->nSize);
          }
        }
      }
      else {
        if (p->nObjs[3] != p->vCoAttrs->nSize) {
          __assert_fail("If_ManCoNum(p) == Vec_IntSize(p->vCoAttrs)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTime.c"
                        ,0x1c3,"void If_ManComputeRequired(If_Man_t *)");
        }
        pVVar7 = p->vCos;
        if (0 < pVVar7->nSize) {
          uVar15 = 0;
          do {
            if ((long)p->vCoAttrs->nSize <= (long)uVar15) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            switch(p->vCoAttrs->pArray[uVar15]) {
            case 0:
              pTVar12 = p->pManTim;
              fVar17 = p->RequiredGlo;
              break;
            case 1:
              pTVar12 = p->pManTim;
              fVar17 = *(float *)(*(long *)((long)pVVar7->pArray[uVar15] + 0x18) + 0x5c);
              break;
            case 2:
              pTVar12 = p->pManTim;
              fVar17 = 1e+20;
              break;
            case -1:
              goto switchD_0040bfe0_caseD_ffffffff;
            default:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTime.c"
                            ,0x1ce,"void If_ManComputeRequired(If_Man_t *)");
            }
            pObj = (char *)(uVar15 & 0xffffffff);
            Tim_ManSetCoRequired(pTVar12,(int)uVar15,fVar17);
switchD_0040bfe0_caseD_ffffffff:
            uVar15 = uVar15 + 1;
            pVVar7 = p->vCos;
          } while ((long)uVar15 < (long)pVVar7->nSize);
        }
      }
      pVVar7 = p->vObjsRev;
      if (0 < pVVar7->nSize) {
        lVar16 = 0;
        do {
          puVar4 = (uint *)pVVar7->pArray[lVar16];
          switch(*puVar4 & 0xf) {
          case 1:
            break;
          case 2:
            pObj = (char *)(ulong)puVar4[2];
            Tim_ManSetCiRequired(p->pManTim,puVar4[2],(float)puVar4[0xd]);
            break;
          case 3:
            pObj = (char *)(ulong)puVar4[2];
            fVar18 = Tim_ManGetCoRequired(p->pManTim,puVar4[2]);
            fVar17 = *(float *)(*(long *)(puVar4 + 6) + 0x34);
            if (fVar17 <= fVar18) {
              fVar18 = fVar17;
            }
            *(float *)(*(long *)(puVar4 + 6) + 0x34) = fVar18;
            break;
          case 4:
            if (puVar4[3] != 0) {
              If_CutPropagateRequired
                        (p,(If_Obj_t *)pObj,(If_Cut_t *)(puVar4 + 0x14),(float)puVar4[0xd]);
            }
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTime.c"
                          ,0x202,"void If_ManComputeRequired(If_Man_t *)");
          }
          lVar16 = lVar16 + 1;
          pVVar7 = p->vObjsRev;
        } while (lVar16 < pVVar7->nSize);
      }
    }
  }
  return;
}

Assistant:

void If_ManComputeRequired( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i, Counter;
    float reqTime;

    // compute area, clean required times, collect nodes used in the mapping
//    p->AreaGlo = If_ManScanMapping( p );
    If_ManMarkMapping( p );
    if ( p->pManTim == NULL )
    {
        // get the global required times
        p->RequiredGlo = If_ManDelayMax( p, 0 );

        // consider the case when the required times are given
        if ( p->pPars->pTimesReq && !p->pPars->fAreaOnly )
        {
            // make sure that the required time hold
            Counter = 0;
            If_ManForEachCo( p, pObj, i )
            {
                if ( If_ObjArrTime(If_ObjFanin0(pObj)) > p->pPars->pTimesReq[i] + p->fEpsilon )
                {
                    If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj));
                    Counter++;
    //                Abc_Print( 0, "Required times are violated for output %d (arr = %d; req = %d).\n", 
    //                    i, (int)If_ObjArrTime(If_ObjFanin0(pObj)), (int)p->pPars->pTimesReq[i] );
                }
                else
                    If_ObjFanin0(pObj)->Required = p->pPars->pTimesReq[i];
            }
            if ( Counter && !p->fReqTimeWarn )
            {
                Abc_Print( 0, "Required times are exceeded at %d output%s. The earliest arrival times are used.\n", Counter, Counter > 1 ? "s":"" );
                p->fReqTimeWarn = 1;
            }
        }
        else
        {
            // find new delay target
            if ( p->pPars->nRelaxRatio && p->pPars->DelayTargetNew == 0 )
                p->pPars->DelayTargetNew = p->RequiredGlo * (100.0 + p->pPars->nRelaxRatio) / 100.0; 

            // update the required times according to the target
            if ( p->pPars->DelayTarget != -1 )
            {
                if ( p->RequiredGlo > p->pPars->DelayTarget + p->fEpsilon )
                {
                    if ( p->fNextRound == 0 )
                    {
                        p->fNextRound = 1;
                        Abc_Print( 0, "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n", p->pPars->DelayTarget );
                    }
                }
                else if ( p->RequiredGlo < p->pPars->DelayTarget - p->fEpsilon )
                {
                    if ( p->fNextRound == 0 )
                    {
                        p->fNextRound = 1;
//                        Abc_Print( 0, "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->RequiredGlo, p->pPars->DelayTarget );
                    }
                    p->RequiredGlo = p->pPars->DelayTarget;
                }
            }
            else if ( p->pPars->DelayTargetNew > 0 ) // relax the required times 
                p->RequiredGlo = p->pPars->DelayTargetNew;
            // do not propagate required times if area minimization is requested
            if ( p->pPars->fAreaOnly ) 
                return;
            // set the required times for the POs
            if ( p->pPars->fDoAverage )
            {
                if ( p->pPars->nRelaxRatio )
                {
                    If_ManForEachCo( p, pObj, i )
                        If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj)) * (100.0 + p->pPars->nRelaxRatio) / 100.0;
                }
                else
                {
                    If_ManForEachCo( p, pObj, i )
                        If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj));
                }
            }
            else if ( p->pPars->fLatchPaths )
            {
                If_ManForEachLatchInput( p, pObj, i )
                    If_ObjFanin0(pObj)->Required = p->RequiredGlo;
            }
            else 
            {
                If_ManForEachCo( p, pObj, i )
                    If_ObjFanin0(pObj)->Required = p->RequiredGlo;
            }
        }
        // go through the nodes in the reverse topological order
    //    Vec_PtrForEachEntry( If_Obj_t *, p->vMapped, pObj, i )
    //        If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
        If_ManForEachObjReverse( p, pObj, i )
        {
            if ( pObj->nRefs == 0 )
                continue;
            If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
        }
    }
    else
    {
        // get the global required times
        p->RequiredGlo = If_ManDelayMax( p, 0 );

        // find new delay target
        if ( p->pPars->nRelaxRatio && p->pPars->DelayTargetNew == 0 )
            p->pPars->DelayTargetNew = p->RequiredGlo * (100.0 + p->pPars->nRelaxRatio) / 100.0; 

        // update the required times according to the target
        if ( p->pPars->DelayTarget != -1 )
        {
            if ( p->RequiredGlo > p->pPars->DelayTarget + p->fEpsilon )
            {
                if ( p->fNextRound == 0 )
                {
                    p->fNextRound = 1;
                    Abc_Print( 0, "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n", p->pPars->DelayTarget );
                }
            }
            else if ( p->RequiredGlo < p->pPars->DelayTarget - p->fEpsilon )
            {
                if ( p->fNextRound == 0 )
                {
                    p->fNextRound = 1;
//                    Abc_Print( 0, "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->RequiredGlo, p->pPars->DelayTarget );
                }
                p->RequiredGlo = p->pPars->DelayTarget;
            }
        }
        else if ( p->pPars->DelayTargetNew > 0 ) // relax the required times 
            p->RequiredGlo = p->pPars->DelayTargetNew;

        // do not propagate required times if area minimization is requested
        if ( p->pPars->fAreaOnly ) 
            return;
        // set the required times for the POs
        Tim_ManIncrementTravId( p->pManTim );
        if ( p->vCoAttrs )
        {
            assert( If_ManCoNum(p) == Vec_IntSize(p->vCoAttrs) );
            If_ManForEachCo( p, pObj, i )
            { 
                if ( Vec_IntEntry(p->vCoAttrs, i) == -1 )       // -1=internal
                    continue;
                if ( Vec_IntEntry(p->vCoAttrs, i) == 0 )        //  0=optimize
                    Tim_ManSetCoRequired( p->pManTim, i, p->RequiredGlo );
                else if ( Vec_IntEntry(p->vCoAttrs, i) == 1 )   //  1=keep
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) );
                else if ( Vec_IntEntry(p->vCoAttrs, i) == 2 )   //  2=relax
                    Tim_ManSetCoRequired( p->pManTim, i, IF_FLOAT_LARGE );
                else assert( 0 );
            }
        }
        else if ( p->pPars->fDoAverage )
        {
            if ( p->pPars->nRelaxRatio )
            {
                If_ManForEachCo( p, pObj, i )
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) * (100.0 + p->pPars->nRelaxRatio) / 100.0 );
            }
            else
            {
                If_ManForEachCo( p, pObj, i )
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) );
            }
        }
        else if ( p->pPars->fLatchPaths )
        {
            If_ManForEachPo( p, pObj, i )
                Tim_ManSetCoRequired( p->pManTim, i, IF_FLOAT_LARGE );
            If_ManForEachLatchInput( p, pObj, i )
                Tim_ManSetCoRequired( p->pManTim, i, p->RequiredGlo );
        }
        else  
        {
            Tim_ManInitPoRequiredAll( p->pManTim, p->RequiredGlo );
//            If_ManForEachCo( p, pObj, i )
//                Tim_ManSetCoRequired( p->pManTim, pObj->IdPio, p->RequiredGlo );
        }
        // go through the nodes in the reverse topological order
        If_ManForEachObjReverse( p, pObj, i )
        {
            if ( If_ObjIsAnd(pObj) )
            {
                if ( pObj->nRefs == 0 )
                    continue;
                If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
            }
            else if ( If_ObjIsCi(pObj) )
            {
                reqTime = pObj->Required;
                Tim_ManSetCiRequired( p->pManTim, pObj->IdPio, reqTime );
            }
            else if ( If_ObjIsCo(pObj) )
            {
                reqTime = Tim_ManGetCoRequired( p->pManTim, pObj->IdPio );
                If_ObjFanin0(pObj)->Required = IF_MIN( reqTime, If_ObjFanin0(pObj)->Required );
            }
            else if ( If_ObjIsConst1(pObj) )
            {
            }
            else // add the node to the mapper
                assert( 0 );
        }
    }
}